

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall Assimp::IFC::Schema_2x3::IfcSpaceType::IfcSpaceType(IfcSpaceType *this)

{
  *(undefined ***)&this->field_0x1c0 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x1c8 = 0;
  *(char **)&this->field_0x1d0 = "IfcSpaceType";
  IfcSpatialStructureElementType::IfcSpatialStructureElementType
            ((IfcSpatialStructureElementType *)this,&PTR_construction_vtable_24__00857078);
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>).aux_is_derived.
  super__Base_bitset<1UL>._M_w = 0;
  *(undefined8 *)this = 0x856f48;
  *(undefined8 *)&this->field_0x1c0 = 0x857060;
  *(undefined8 *)&this->field_0x88 = 0x856f70;
  *(undefined8 *)&this->field_0x98 = 0x856f98;
  *(undefined8 *)&this->field_0xf0 = 0x856fc0;
  *(undefined8 *)&this->field_0x148 = 0x856fe8;
  *(undefined8 *)&this->field_0x180 = 0x857010;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>)._vptr_ObjectHelper =
       (_func_int **)0x857038;
  *(undefined1 **)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>).field_0x10
       = &(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>).field_0x20;
  *(undefined8 *)&(this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>).field_0x18
       = 0;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcSpaceType,_1UL>).field_0x20 = 0;
  return;
}

Assistant:

IfcSpaceType() : Object("IfcSpaceType") {}